

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

string_t __thiscall
duckdb::StrfTimeFormat::ConvertTimestampValue
          (StrfTimeFormat *this,timestamp_ns_t *input,Vector *result)

{
  timestamp_t timestamp;
  bool bVar1;
  undefined8 *in_RSI;
  int32_t *in_RDI;
  idx_t len;
  char *tz_name;
  int32_t data [8];
  int32_t nanos;
  dtime_t time;
  date_t date;
  string_t target;
  idx_t in_stack_fffffffffffffee8;
  Vector *in_stack_fffffffffffffef0;
  int32_t *in_stack_fffffffffffffef8;
  timestamp_t in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  Vector *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  StrfTimeFormat *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  date_t in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  int32_t *in_stack_ffffffffffffff40;
  StrfTimeFormat *in_stack_ffffffffffffff48;
  date_t in_stack_ffffffffffffff54;
  int32_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  date_t *in_stack_ffffffffffffff68;
  timestamp_ns_t in_stack_ffffffffffffff70;
  int32_t iStack_6c;
  int32_t iStack_68;
  int32_t iStack_64;
  int local_60 [4];
  undefined8 local_50;
  int local_44;
  dtime_t local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  anon_union_16_2_67f50693_for_value local_10;
  
  bVar1 = Timestamp::IsFinite(in_stack_ffffffffffffff00);
  if (bVar1) {
    local_50 = *in_RSI;
    Timestamp::Convert(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (dtime_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    Date::Convert((date_t)(int32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                  (int32_t *)in_stack_ffffffffffffff08,(int32_t *)in_stack_ffffffffffffff00.value,
                  in_stack_fffffffffffffef8);
    Time::Convert(local_40,&iStack_6c,&iStack_68,&iStack_64,local_60);
    local_60[0] = local_44 + local_60[0] * 1000;
    local_60[1] = 0;
    GetLength(in_stack_ffffffffffffff28,in_stack_ffffffffffffff34,in_RDI,in_stack_ffffffffffffff18);
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    string_t::GetDataWriteable((string_t *)in_stack_fffffffffffffef0);
    FormatStringNS(in_stack_ffffffffffffff48,in_stack_ffffffffffffff54,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38,
                   (char *)CONCAT44(in_stack_ffffffffffffff34.days,in_stack_ffffffffffffff30));
    string_t::Finalize((string_t *)in_stack_ffffffffffffff00.value);
  }
  else {
    timestamp.value._4_4_ = in_stack_ffffffffffffffcc;
    timestamp.value._0_4_ = in_stack_ffffffffffffffc8;
    Timestamp::ToString_abi_cxx11_(timestamp);
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddString(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

string_t StrfTimeFormat::ConvertTimestampValue(const timestamp_ns_t &input, Vector &result) const {
	if (Timestamp::IsFinite(input)) {
		date_t date;
		dtime_t time;
		int32_t nanos;
		Timestamp::Convert(input, date, time, nanos);

		int32_t data[8]; // year, month, day, hour, min, sec, ns, offset
		Date::Convert(date, data[0], data[1], data[2]);
		Time::Convert(time, data[3], data[4], data[5], data[6]);
		data[6] *= Interval::NANOS_PER_MICRO;
		data[6] += nanos;
		data[7] = 0;
		const char *tz_name = nullptr;

		idx_t len = GetLength(date, data, tz_name);
		string_t target = StringVector::EmptyString(result, len);
		FormatStringNS(date, data, tz_name, target.GetDataWriteable());
		target.Finalize();
		return target;
	} else {
		return StringVector::AddString(result, Timestamp::ToString(input));
	}
}